

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSim.c
# Opt level: O2

int Saig_ManSimDataInit(Aig_Man_t *p,Abc_Cex_t *pCex,Vec_Ptr_t *vSimInfo,Vec_Int_t *vRes)

{
  int Value;
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pObj;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  
  uVar3 = 0;
  while (uVar4 = (uint)uVar3, (int)uVar4 < p->nRegs) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,p->nTruePis + uVar4);
    Saig_ManSimInfoSet(vSimInfo,pAVar2,0,
                       (((uint)(&pCex[1].iPo)[uVar3 >> 5] >> (uVar4 & 0x1f) & 1) != 0) + 1);
    uVar3 = (ulong)(uVar4 + 1);
  }
  iVar1 = 0;
  while (iVar1 <= pCex->iFrame) {
    Saig_ManSimInfoSet(vSimInfo,p->pConst1,iVar1,2);
    for (iVar5 = 0; uVar4 = (int)uVar3 + iVar5, iVar5 < p->nTruePis; iVar5 = iVar5 + 1) {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,iVar5);
      Saig_ManSimInfoSet(vSimInfo,pAVar2,iVar1,
                         (((uint)(&pCex[1].iPo)[(int)uVar4 >> 5] >> (uVar4 & 0x1f) & 1) != 0) + 1);
    }
    if (vRes != (Vec_Int_t *)0x0) {
      for (lVar6 = 0; lVar6 < vRes->nSize; lVar6 = lVar6 + 1) {
        pAVar2 = Aig_ManCi(p,vRes->pArray[lVar6]);
        Saig_ManSimInfoSet(vSimInfo,pAVar2,iVar1,3);
      }
    }
    for (iVar5 = 0; iVar5 < p->vObjs->nSize; iVar5 = iVar5 + 1) {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar5);
      if ((pAVar2 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar2->field_0x18 & 7) - 7)) {
        Saig_ManExtendOneEval(vSimInfo,pAVar2,iVar1);
      }
    }
    for (iVar5 = 0; iVar5 < p->vCos->nSize; iVar5 = iVar5 + 1) {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,iVar5);
      Saig_ManExtendOneEval(vSimInfo,pAVar2,iVar1);
    }
    if (iVar1 == pCex->iFrame) break;
    for (iVar5 = 0; iVar5 < p->nRegs; iVar5 = iVar5 + 1) {
      pAVar2 = Saig_ManLi(p,iVar5);
      pObj = Saig_ManLo(p,iVar5);
      Value = Saig_ManSimInfoGet(vSimInfo,pAVar2,iVar1);
      Saig_ManSimInfoSet(vSimInfo,pObj,iVar1 + 1,Value);
    }
    uVar3 = (ulong)uVar4;
    iVar1 = iVar1 + 1;
  }
  pAVar2 = Aig_ManCo(p,pCex->iPo);
  iVar1 = Saig_ManSimInfoGet(vSimInfo,pAVar2,pCex->iFrame);
  return iVar1;
}

Assistant:

int Saig_ManSimDataInit( Aig_Man_t * p, Abc_Cex_t * pCex, Vec_Ptr_t * vSimInfo, Vec_Int_t * vRes )
{
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i, f, Entry, iBit = 0;
    Saig_ManForEachLo( p, pObj, i )
        Saig_ManSimInfoSet( vSimInfo, pObj, 0, Abc_InfoHasBit(pCex->pData, iBit++)?SAIG_ONE:SAIG_ZER );
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        Saig_ManSimInfoSet( vSimInfo, Aig_ManConst1(p), f, SAIG_ONE );
        Saig_ManForEachPi( p, pObj, i )
            Saig_ManSimInfoSet( vSimInfo, pObj, f, Abc_InfoHasBit(pCex->pData, iBit++)?SAIG_ONE:SAIG_ZER );
        if ( vRes )
        Vec_IntForEachEntry( vRes, Entry, i )
            Saig_ManSimInfoSet( vSimInfo, Aig_ManCi(p, Entry), f, SAIG_UND );
        Aig_ManForEachNode( p, pObj, i )
            Saig_ManExtendOneEval( vSimInfo, pObj, f );
        Aig_ManForEachCo( p, pObj, i )
            Saig_ManExtendOneEval( vSimInfo, pObj, f );
        if ( f == pCex->iFrame )
            break;
        Saig_ManForEachLiLo( p, pObjLi, pObjLo, i )
            Saig_ManSimInfoSet( vSimInfo, pObjLo, f+1, Saig_ManSimInfoGet(vSimInfo, pObjLi, f) );
    }
    // make sure the output of the property failed
    pObj = Aig_ManCo( p, pCex->iPo );
    return Saig_ManSimInfoGet( vSimInfo, pObj, pCex->iFrame );
}